

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O3

void Mio_SopPushSCC(Vec_Int_t *p,uint c)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar4 = p->nSize;
  if ((int)uVar4 < 1) {
    uVar3 = 0;
  }
  else {
    piVar2 = p->pArray;
    lVar6 = 0;
    uVar3 = 0;
    do {
      uVar1 = piVar2[lVar6];
      if ((uVar1 | c) == c) {
        if ((uint)lVar6 != uVar3) {
          __assert_fail("i == k",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mio/mioSop.c"
                        ,0x3c,"void Mio_SopPushSCC(Vec_Int_t *, unsigned int)");
        }
        return;
      }
      if ((uVar1 | c) != uVar1) {
        if (((int)uVar3 < 0) || (uVar4 <= uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar5 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
        piVar2[uVar5] = uVar1;
        uVar4 = p->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)uVar4);
  }
  if ((int)uVar4 < (int)uVar3) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  p->nSize = uVar3;
  Vec_IntPush(p,c);
  return;
}

Assistant:

void Mio_SopPushSCC( Vec_Int_t * p, unsigned c )
{
    unsigned Entry;
    int i, k = 0;
    Vec_IntForEachEntry( p, Entry, i )
    {
        if ( Mio_CubeContains( Entry, c ) ) // Entry contains c
        {
            assert( i == k );
            return;
        }
        if ( Mio_CubeContains( c, Entry ) ) // c contains Entry
            continue;
        Vec_IntWriteEntry( p, k++, Entry );
    }
    Vec_IntShrink( p, k );
    Vec_IntPush( p, c );
}